

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O3

void __thiscall depspawn::Observer::~Observer(Observer *this)

{
  bool bVar1;
  byte bVar2;
  iterator iVar3;
  byte bVar4;
  Workitem *pWVar5;
  unordered_set<depspawn::internal::Workitem_*,_std::hash<depspawn::internal::Workitem_*>,_std::equal_to<depspawn::internal::Workitem_*>,_std::allocator<depspawn::internal::Workitem_*>_>
  fathers;
  undefined1 local_82;
  undefined1 local_81;
  Workitem *local_80;
  Workitem *local_78;
  Observer *local_70;
  _Hashtable<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>,_std::__detail::_Identity,_std::equal_to<depspawn::internal::Workitem_*>,_std::hash<depspawn::internal::Workitem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_78 = this->cur_father_;
  std::
  _Hashtable<depspawn::internal::Workitem*,depspawn::internal::Workitem*,std::allocator<depspawn::internal::Workitem*>,std::__detail::_Identity,std::equal_to<depspawn::internal::Workitem*>,std::hash<depspawn::internal::Workitem*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<depspawn::internal::Workitem*const*>
            ((_Hashtable<depspawn::internal::Workitem*,depspawn::internal::Workitem*,std::allocator<depspawn::internal::Workitem*>,std::__detail::_Identity,std::equal_to<depspawn::internal::Workitem*>,std::hash<depspawn::internal::Workitem*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_68,&local_78,&local_70,0,&local_80,&local_81,&local_82);
  LOCK();
  (anonymous_namespace)::ObserversAtWork = (anonymous_namespace)::ObserversAtWork + 1;
  UNLOCK();
  do {
  } while (((anonymous_namespace)::eraser_assigned & 1) != 0);
  pWVar5 = this->cur_father_;
  if (pWVar5 != (Workitem *)0x0) {
    pWVar5 = this->limit_;
  }
  bVar4 = 1;
  local_70 = this;
  do {
    local_80 = (anonymous_namespace)::worklist;
    if (pWVar5 == (anonymous_namespace)::worklist) break;
    bVar1 = false;
    bVar2 = 0;
    do {
      iVar3 = std::
              _Hashtable<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>,_std::__detail::_Identity,_std::equal_to<depspawn::internal::Workitem_*>,_std::hash<depspawn::internal::Workitem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&local_68,&local_80->father);
      if (iVar3.super__Node_iterator_base<depspawn::internal::Workitem_*,_false>._M_cur ==
          (__node_type *)0x0) {
        if ((bVar4 & 1) == 0) {
          internal::TaskPool::try_run(internal::TP);
        }
      }
      else {
        local_78 = (Workitem *)&local_68;
        std::
        _Hashtable<depspawn::internal::Workitem*,depspawn::internal::Workitem*,std::allocator<depspawn::internal::Workitem*>,std::__detail::_Identity,std::equal_to<depspawn::internal::Workitem*>,std::hash<depspawn::internal::Workitem*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<depspawn::internal::Workitem*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<depspawn::internal::Workitem*,false>>>>
                  ((_Hashtable<depspawn::internal::Workitem*,depspawn::internal::Workitem*,std::allocator<depspawn::internal::Workitem*>,std::__detail::_Identity,std::equal_to<depspawn::internal::Workitem*>,std::hash<depspawn::internal::Workitem*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_68,&local_80,&local_78);
        if ((short)local_80->status < 4) {
          bVar1 = internal::TaskPool::try_run(internal::TP);
          bVar2 = bVar1 | bVar2;
          bVar1 = true;
        }
      }
      local_80 = local_80->next;
    } while (local_80 != pWVar5);
    if (bVar2 == 0) {
      bVar4 = local_70->priority_;
    }
  } while (bVar1);
  LOCK();
  (anonymous_namespace)::ObserversAtWork = (anonymous_namespace)::ObserversAtWork + -1;
  UNLOCK();
  std::
  _Hashtable<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>,_std::__detail::_Identity,_std::equal_to<depspawn::internal::Workitem_*>,_std::hash<depspawn::internal::Workitem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

Observer::~Observer()
  { std::unordered_set<internal::Workitem *> fathers({cur_father_});
    internal::Workitem *p;
    bool must_reiterate;
    
    ObserversAtWork.fetch_add(1); //disable future attempts to erase Workitems during my activity
    while (eraser_assigned) {
      // Wait for current eraser, if any, to finish
    }
    
    /* if there was a cur_father_, since we are inside it, and limit_ is it or more recent,
     limit_ cannot have been deallocated, so limit_ is a safe limit.
     
     if cur_father_=null and limit_ was deallocated, all previous tasks finished,
     and so we have to execute everything up to the end of the list, which is cur_father_=null.
     
     if cur_father_=null and limit_ was not deallocated, we have to execute
     everything up to limit_, but it could have been deallocated, so null is a safe limit,
     although we are waiting for more task that we should actually do.
     
     Also it is interesting to notice that no Workitem in the high-level critical path can
     be Filling, but Workitems descended from them could.
     */
    
    internal::Workitem * const safe_end = (cur_father_ != nullptr) ? limit_ : nullptr;
    //printf("%p w until %p!=NULL->%p\n", enum_thr_spec_father, cur_father_, limit_);

    //The first round always has priority, i.e., is only devoted to the critical path
    bool priority = true;

    do {
      must_reiterate = false;
      bool helped = false;
  
      // We must begin from worklist because new work we must do may have been spawned
      for (p = worklist; p != safe_end; p = p->next) {
        if (fathers.find(p->father) != fathers.end()) { //Workitem in the critical path
          fathers.insert(p); //it could be the father of other tasks that would have to finish
          if (p->status < Workitem::Status_t::Done) {
            must_reiterate = true;
            bool helped_here = try_to_run(p);
            helped = helped || helped_here;
          }
        } else {
          if (!priority) {
            try_to_run(p);
          }
        }
      }
      
      // While we are able to help with tasks in the critical path, we remain focused on it.
      // Otherwise we adopt the priority specified by the user.
      priority = helped ? priority : priority_;
      
    } while (must_reiterate);
    
    //printf("%p exit\n", enum_thr_spec_father);
    
    ObserversAtWork.fetch_sub(1); //I'm done
  }